

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

void __thiscall peg::Capture::Capture(Capture *this,shared_ptr<peg::Ope> *ope,MatchAction *ma)

{
  MatchAction *ma_local;
  shared_ptr<peg::Ope> *ope_local;
  Capture *this_local;
  
  Ope::Ope(&this->super_Ope);
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__Capture_00210e88;
  std::shared_ptr<peg::Ope>::shared_ptr(&this->ope_,ope);
  std::function<void_(const_char_*,_unsigned_long,_peg::Context_&)>::function
            (&this->match_action_,ma);
  return;
}

Assistant:

Capture(const std::shared_ptr<Ope> &ope, MatchAction ma)
      : ope_(ope), match_action_(ma) {}